

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set_test.cpp
# Opt level: O1

void __thiscall
adt_set_test_DefaultConstructor_Test::TestBody(adt_set_test_DefaultConstructor_Test *this)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  AssertHelperData *pAVar7;
  undefined4 *puVar8;
  char *pcVar9;
  long lVar10;
  key_str *pacVar11;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  AssertHelper local_58;
  internal local_50 [8];
  undefined8 *local_48;
  undefined8 local_40;
  long local_38;
  
  local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
  uVar3 = log_policy_format_text();
  uVar4 = log_policy_schedule_sync();
  uVar5 = log_policy_storage_sequential();
  uVar6 = log_policy_stream_stdio(_stdout);
  local_58.data_._0_4_ = log_configure_impl("metacall",4,uVar3,uVar4,uVar5,uVar6);
  testing::internal::CmpHelperEQ<int,int>
            (local_50,"(int)0",
             "(int)log_configure_impl(\"metacall\", 4, log_policy_format_text(), log_policy_schedule_sync(), log_policy_storage_sequential(), log_policy_stream_stdio(stdout))"
             ,(int *)&local_60,(int *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x48,pcVar9);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar1);
  }
  local_40 = set_create(hash_callback_str,comparable_callback_str);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f;
  local_58.data_ = (AssertHelperData *)&DAT_0000003f;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_50,"(size_t)key_array_size","(size_t)value_array_size",(unsigned_long *)&local_60
             ,(unsigned_long *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x6f,pcVar9);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar1);
  }
  pacVar11 = TestBody::key_array;
  lVar10 = 0;
  do {
    local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
    uVar2 = set_insert(local_40,pacVar11,(long)TestBody::value_array + lVar10);
    local_58.data_._0_4_ = uVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_50,"(int)0","(int)set_insert(s, key_array[i], &value_array[i])",
               (int *)&local_60,(int *)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      pcVar9 = "";
      if (local_48 != (undefined8 *)0x0) {
        pcVar9 = (char *)*local_48;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0x74,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    puVar1 = local_48;
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
    lVar10 = lVar10 + 4;
    pacVar11 = pacVar11 + 1;
  } while (lVar10 != 0xfc);
  set_iterate(local_40,set_cb_iterate_str_to_int,0);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)iterator_counter;
  local_58.data_ = (AssertHelperData *)&DAT_0000003f;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_50,"(size_t)iterator_counter","(size_t)value_array_size",
             (unsigned_long *)&local_60,(unsigned_long *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x79,pcVar9);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar1);
  }
  pacVar11 = TestBody::key_array;
  local_38 = 0;
  do {
    pAVar7 = (AssertHelperData *)set_get(local_40,pacVar11);
    local_60._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_58.data_ = pAVar7;
    testing::internal::CmpHelperNE<int*,int*>
              (local_50,"(int *)__null","(int *)value",(int **)&local_60,(int **)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      pcVar9 = "";
      if (local_48 != (undefined8 *)0x0) {
        pcVar9 = (char *)*local_48;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0x80,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    puVar1 = local_48;
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
    local_60._M_head_impl._0_4_ = *(undefined4 *)((long)TestBody::value_array + local_38);
    local_58.data_._0_4_ = pAVar7->type;
    testing::internal::CmpHelperEQ<int,int>
              (local_50,"(int)value_array[i]","(int)*value",(int *)&local_60,(int *)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      pcVar9 = "";
      if (local_48 != (undefined8 *)0x0) {
        pcVar9 = (char *)*local_48;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0x82,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    puVar1 = local_48;
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
    local_38 = local_38 + 4;
    pacVar11 = pacVar11 + 1;
  } while (local_38 != 0xfc);
  local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
  uVar2 = set_insert(local_40,0x14d5c7,TestBody::value_array);
  local_58.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_50,"(int)0","(int)set_insert(s, key_array[1], &value_array[0])",(int *)&local_60,
             (int *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x86,pcVar9);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar1);
  }
  puVar8 = (undefined4 *)set_get(local_40,0x14d5c7);
  local_60._M_head_impl._0_4_ = TestBody::value_array[0];
  local_58.data_._0_4_ = *puVar8;
  testing::internal::CmpHelperEQ<int,int>
            (local_50,"(int)value_array[0]","(int)*value",(int *)&local_60,(int *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x8a,pcVar9);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar1);
  }
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f;
  local_58.data_ = (AssertHelperData *)set_size(local_40);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_50,"(size_t)key_array_size","(size_t)set_size(s)",(unsigned_long *)&local_60,
             (unsigned_long *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0x8c,pcVar9);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar1);
  }
  pacVar11 = TestBody::key_array;
  lVar10 = 0;
  do {
    puVar8 = (undefined4 *)set_remove(local_40,pacVar11);
    if (lVar10 == 4) {
      local_60._M_head_impl._0_4_ = TestBody::value_array[0];
      local_58.data_._0_4_ = *puVar8;
      testing::internal::CmpHelperEQ<int,int>
                (local_50,"(int)value_array[0]","(int)*remove_value",(int *)&local_60,
                 (int *)&local_58);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        pcVar9 = "";
        if (local_48 != (undefined8 *)0x0) {
          pcVar9 = (char *)*local_48;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                   ,0x95,pcVar9);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
LAB_00109e60:
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_60._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_60._M_head_impl + 8))();
        }
      }
    }
    else {
      local_60._M_head_impl._0_4_ = *(undefined4 *)((long)TestBody::value_array + lVar10);
      local_58.data_._0_4_ = *puVar8;
      testing::internal::CmpHelperEQ<int,int>
                (local_50,"(int)value_array[i]","(int)*remove_value",(int *)&local_60,
                 (int *)&local_58);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        pcVar9 = "";
        if (local_48 != (undefined8 *)0x0) {
          pcVar9 = (char *)*local_48;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                   ,0x99,pcVar9);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
        goto LAB_00109e60;
      }
    }
    puVar1 = local_48;
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
    lVar10 = lVar10 + 4;
    pacVar11 = pacVar11 + 1;
  } while (lVar10 != 0xfc);
  set_destroy(local_40);
  local_40 = set_create(hash_callback_ptr,comparable_callback_ptr);
  lVar10 = 0;
  do {
    local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
    uVar2 = set_insert(local_40,(long)TestBody()::key_array + lVar10,
                       (long)TestBody()::value_array + lVar10);
    local_58.data_._0_4_ = uVar2;
    testing::internal::CmpHelperEQ<int,int>
              (local_50,"(int)0","(int)set_insert(s, &key_array[i], &value_array[i])",
               (int *)&local_60,(int *)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      pcVar9 = "";
      if (local_48 != (undefined8 *)0x0) {
        pcVar9 = (char *)*local_48;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0xb7,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    puVar1 = local_48;
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xfc);
  set_iterate(local_40,set_cb_iterate_ptr_to_int,0);
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       iterator_counter_ptr;
  local_58.data_ = (AssertHelperData *)&DAT_0000003f;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_50,"(size_t)iterator_counter_ptr","(size_t)value_array_size",
             (unsigned_long *)&local_60,(unsigned_long *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0xbc,pcVar9);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar1);
  }
  lVar10 = 0;
  do {
    pAVar7 = (AssertHelperData *)set_get(local_40,(long)TestBody()::key_array + lVar10);
    local_60._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_58.data_ = pAVar7;
    testing::internal::CmpHelperNE<int*,int*>
              (local_50,"(int *)__null","(int *)value",(int **)&local_60,(int **)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      pcVar9 = "";
      if (local_48 != (undefined8 *)0x0) {
        pcVar9 = (char *)*local_48;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0xc3,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    puVar1 = local_48;
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
    local_60._M_head_impl._0_4_ = *(undefined4 *)((long)TestBody()::value_array + lVar10);
    local_58.data_._0_4_ = pAVar7->type;
    testing::internal::CmpHelperEQ<int,int>
              (local_50,"(int)value_array[i]","(int)*value",(int *)&local_60,(int *)&local_58);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      pcVar9 = "";
      if (local_48 != (undefined8 *)0x0) {
        pcVar9 = (char *)*local_48;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                 ,0xc5,pcVar9);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_60._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_60._M_head_impl + 8))();
      }
    }
    puVar1 = local_48;
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0xfc);
  local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
  uVar2 = set_insert(local_40,0x14d9d4,TestBody()::value_array);
  local_58.data_._0_4_ = uVar2;
  testing::internal::CmpHelperEQ<int,int>
            (local_50,"(int)0","(int)set_insert(s, &key_array[1], &value_array[0])",(int *)&local_60
             ,(int *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0xc9,pcVar9);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar1);
  }
  puVar8 = (undefined4 *)set_get(local_40,0x14d9d4);
  local_60._M_head_impl._0_4_ = TestBody()::value_array[0];
  local_58.data_._0_4_ = *puVar8;
  testing::internal::CmpHelperEQ<int,int>
            (local_50,"(int)value_array[0]","(int)*value",(int *)&local_60,(int *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0xcd,pcVar9);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar1);
  }
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f;
  local_58.data_ = (AssertHelperData *)set_size(local_40);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_50,"(size_t)key_array_size","(size_t)set_size(s)",(unsigned_long *)&local_60,
             (unsigned_long *)&local_58);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (local_48 == (undefined8 *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (char *)*local_48;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
               ,0xcf,pcVar9);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  puVar1 = local_48;
  if (local_48 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_48 != local_48 + 2) {
      operator_delete((undefined8 *)*local_48);
    }
    operator_delete(puVar1);
  }
  lVar10 = 0;
  do {
    puVar8 = (undefined4 *)set_remove(local_40,(long)TestBody()::key_array + lVar10);
    if (lVar10 == 4) {
      local_60._M_head_impl._0_4_ = TestBody()::value_array[0];
      local_58.data_._0_4_ = *puVar8;
      testing::internal::CmpHelperEQ<int,int>
                (local_50,"(int)value_array[0]","(int)*remove_value",(int *)&local_60,
                 (int *)&local_58);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        pcVar9 = "";
        if (local_48 != (undefined8 *)0x0) {
          pcVar9 = (char *)*local_48;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                   ,0xd8,pcVar9);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
LAB_0010a5bd:
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (local_60._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_60._M_head_impl + 8))();
        }
      }
    }
    else {
      local_60._M_head_impl._0_4_ = *(undefined4 *)((long)TestBody()::value_array + lVar10);
      local_58.data_._0_4_ = *puVar8;
      testing::internal::CmpHelperEQ<int,int>
                (local_50,"(int)value_array[i]","(int)*remove_value",(int *)&local_60,
                 (int *)&local_58);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_60);
        pcVar9 = "";
        if (local_48 != (undefined8 *)0x0) {
          pcVar9 = (char *)*local_48;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/adt_set_test/source/adt_set_test.cpp"
                   ,0xdc,pcVar9);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_60);
        goto LAB_0010a5bd;
      }
    }
    puVar1 = local_48;
    if (local_48 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_48 != local_48 + 2) {
        operator_delete((undefined8 *)*local_48);
      }
      operator_delete(puVar1);
    }
    lVar10 = lVar10 + 4;
    if (lVar10 == 0xfc) {
      set_destroy(local_40);
      return;
    }
  } while( true );
}

Assistant:

TEST_F(adt_set_test, DefaultConstructor)
{
	EXPECT_EQ((int)0, (int)log_configure("metacall",
						  log_policy_format_text(),
						  log_policy_schedule_sync(),
						  log_policy_storage_sequential(),
						  log_policy_stream_stdio(stdout)));

	/* Hash String */
	{
		set s = set_create(&hash_callback_str, &comparable_callback_str);

		static key_str key_array[] = {
			"aaaaaa", "aaaaab", "aaaaba", "aaaabb",
			"aaabaa", "aaabab", "aaabba", "aaabbb",
			"aabaaa", "aabaab", "aababa", "aababb",
			"aabbaa", "aabbab", "aabbba", "aabbbb",
			"abaaaa", "abaaab", "abaaba", "abaabb",
			"ababaa", "ababab", "ababbb", "abbaaa",
			"abbaab", "abbaba", "abbabb", "abbbaa",
			"abbbab", "abbbba", "abbbbb", "baaaaa",
			"baaaab", "baaaba", "baaabb", "baabaa",
			"baabab", "baabba", "baabbb", "babaaa",
			"babaab", "bababa", "bababb", "babbaa",
			"babbab", "babbba", "babbbb", "bbaaaa",
			"bbaaab", "bbaaba", "bbaabb", "bbabaa",
			"bbabab", "bbabba", "bbabbb", "bbbaaa",
			"bbbaab", "bbbaba", "bbbabb", "bbbbaa",
			"bbbbab", "bbbbba", "bbbbbb"
		};

		static const size_t key_array_size = sizeof(key_array) / sizeof(key_array[0]);

		static int value_array[] = {
			10, 11, 12, 13, 14, 15, 16, 17, 18, 19,
			20, 21, 22, 23, 24, 25, 26, 27, 28, 29,
			30, 31, 32, 33, 34, 35, 36, 37, 38, 39,
			40, 41, 42, 43, 44, 45, 46, 47, 48, 49,
			50, 51, 52, 53, 54, 55, 56, 57, 58, 59,
			60, 61, 62, 63, 64, 65, 66, 67, 68, 69,
			70, 71, 72
		};

		static const size_t value_array_size = sizeof(value_array) / sizeof(value_array[0]);

		EXPECT_EQ((size_t)key_array_size, (size_t)value_array_size);

		/* Insert value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			EXPECT_EQ((int)0, (int)set_insert(s, key_array[i], &value_array[i]));
		}

		set_iterate(s, &set_cb_iterate_str_to_int, NULL);

		EXPECT_EQ((size_t)iterator_counter, (size_t)value_array_size);

		/* Get value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			int *value = (int *)set_get(s, key_array[i]);

			EXPECT_NE((int *)NULL, (int *)value);

			EXPECT_EQ((int)value_array[i], (int)*value);
		}

		/* Overwrite value */
		EXPECT_EQ((int)0, (int)set_insert(s, key_array[1], &value_array[0]));

		int *value = (int *)set_get(s, key_array[1]);

		EXPECT_EQ((int)value_array[0], (int)*value);

		EXPECT_EQ((size_t)key_array_size, (size_t)set_size(s));

		/* Remove value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			int *remove_value = (int *)set_remove(s, key_array[i]);

			if (i == 1)
			{
				EXPECT_EQ((int)value_array[0], (int)*remove_value);
			}
			else
			{
				EXPECT_EQ((int)value_array[i], (int)*remove_value);
			}
		}

		set_destroy(s);
	}

	/* Hash Pointer */
	{
		set s = set_create(&hash_callback_ptr, &comparable_callback_ptr);

		static int value_array[] = {
			10, 11, 12, 13, 14, 15, 16, 17, 18, 19,
			20, 21, 22, 23, 24, 25, 26, 27, 28, 29,
			30, 31, 32, 33, 34, 35, 36, 37, 38, 39,
			40, 41, 42, 43, 44, 45, 46, 47, 48, 49,
			50, 51, 52, 53, 54, 55, 56, 57, 58, 59,
			60, 61, 62, 63, 64, 65, 66, 67, 68, 69,
			70, 71, 72
		};

		static const size_t value_array_size = sizeof(value_array) / sizeof(value_array[0]);

		static int key_array[value_array_size] = { 0 };

		static const size_t key_array_size = value_array_size;

		/* Insert value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			EXPECT_EQ((int)0, (int)set_insert(s, &key_array[i], &value_array[i]));
		}

		set_iterate(s, &set_cb_iterate_ptr_to_int, NULL);

		EXPECT_EQ((size_t)iterator_counter_ptr, (size_t)value_array_size);

		/* Get value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			int *value = (int *)set_get(s, &key_array[i]);

			EXPECT_NE((int *)NULL, (int *)value);

			EXPECT_EQ((int)value_array[i], (int)*value);
		}

		/* Overwrite value */
		EXPECT_EQ((int)0, (int)set_insert(s, &key_array[1], &value_array[0]));

		int *value = (int *)set_get(s, &key_array[1]);

		EXPECT_EQ((int)value_array[0], (int)*value);

		EXPECT_EQ((size_t)key_array_size, (size_t)set_size(s));

		/* Remove value */
		for (size_t i = 0; i < key_array_size; ++i)
		{
			int *remove_value = (int *)set_remove(s, &key_array[i]);

			if (i == 1)
			{
				EXPECT_EQ((int)value_array[0], (int)*remove_value);
			}
			else
			{
				EXPECT_EQ((int)value_array[i], (int)*remove_value);
			}
		}

		set_destroy(s);
	}
}